

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

cf_char_t * cf_strrchr(cf_char_t *s,cf_char_t c)

{
  cf_size_t cVar1;
  cf_size_t cVar2;
  cf_char_t *pcVar3;
  
  if (s == (cf_char_t *)0x0) {
    pcVar3 = (cf_char_t *)0x0;
  }
  else {
    cVar1 = cf_strlen(s);
    do {
      cVar2 = cVar1;
      if (cVar2 == 0) {
        return s;
      }
      cVar1 = cVar2 - 1;
    } while (s[cVar2] != c);
    pcVar3 = s + cVar2;
  }
  return pcVar3;
}

Assistant:

cf_char_t* cf_strrchr(const cf_char_t* s, cf_char_t c) {
    cf_size_t n;
    if(!s) return CF_NULL_PTR;
    n = cf_strlen(s);
    s += n;
    while(n > 0 && *s != c) n--, s--;
    return (n < 0 ? CF_NULL_PTR : (cf_char_t*)s);
}